

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void sha256_done(sha256_ctx *ctx,sha256 *res)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  uint64_t sizedesc;
  
  sVar3 = ctx->bytes;
  uVar1 = sVar3 * 8;
  sizedesc = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | sVar3 << 0x3b;
  add(ctx,sha256_done::pad,(ulong)(0x37U - (int)sVar3 & 0x3f) + 1);
  add(ctx,&sizedesc,8);
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    uVar2 = ctx->s[lVar4];
    (res->u).u32[lVar4] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  ctx->bytes = 0xffffffffffffffff;
  return;
}

Assistant:

void sha256_done(struct sha256_ctx *ctx, struct sha256 *res)
{
	static const unsigned char pad[64] = {0x80};
	uint64_t sizedesc;
	size_t i;

	sizedesc = cpu_to_be64((uint64_t)ctx->bytes << 3);
	/* Add '1' bit to terminate, then all 0 bits, up to next block - 8. */
	add(ctx, pad, 1 + ((128 - 8 - (ctx->bytes % 64) - 1) % 64));
	/* Add number of bits of data (big endian) */
	add(ctx, &sizedesc, 8);
	for (i = 0; i < sizeof(ctx->s) / sizeof(ctx->s[0]); i++)
		res->u.u32[i] = cpu_to_be32(ctx->s[i]);
	invalidate_sha256(ctx);
}